

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_validator.cpp
# Opt level: O0

string * __thiscall
SchemaValidator::get_error_abi_cxx11_(string *__return_storage_ptr__,SchemaValidator *this)

{
  SchemaValidator *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->error_);
  return __return_storage_ptr__;
}

Assistant:

std::string SchemaValidator::get_error() {
    return error_;
}